

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtcpserver.cpp
# Opt level: O3

void __thiscall QTcpServer::addPendingConnection(QTcpServer *this,QTcpSocket *socket)

{
  QPodArrayOps<QTcpSocket*> *this_00;
  long in_FS_OFFSET;
  undefined1 local_39;
  QTcpSocket *local_38;
  undefined1 *local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QPodArrayOps<QTcpSocket*> *)(*(long *)&this->field_0x8 + 0x80);
  local_38 = socket;
  QtPrivate::QPodArrayOps<QTcpSocket*>::emplace<QTcpSocket*&>
            (this_00,*(qsizetype *)(*(long *)&this->field_0x8 + 0x90),&local_38);
  QList<QTcpSocket_*>::end((QList<QTcpSocket_*> *)this_00);
  local_38 = (QTcpSocket *)0x0;
  local_30 = &local_39;
  QMetaObject::activate(&this->super_QObject,&staticMetaObject,1,&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTcpServer::addPendingConnection(QTcpSocket* socket)
{
    d_func()->pendingConnections.append(socket);
    emit pendingConnectionAvailable(QPrivateSignal());
}